

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

void initAvailableConvertersList(UErrorCode *errCode)

{
  UBool UVar1;
  UEnumeration *en;
  UConverter *converter;
  char *converterName_00;
  ulong uVar2;
  char *converterName;
  undefined1 local_140 [4];
  int32_t idx;
  UConverter tempConverter;
  UErrorCode localStatus;
  int32_t allConverterCount;
  UEnumeration *allConvEnum;
  UErrorCode *errCode_local;
  
  ucnv_enableCleanup_63();
  en = ucnv_openAllNames_63(errCode);
  tempConverter.toUCallbackReason = uenum_count_63(en,errCode);
  UVar1 = U_FAILURE(*errCode);
  if (UVar1 == '\0') {
    gAvailableConverters = (char **)uprv_malloc_63((long)(int)tempConverter.toUCallbackReason << 3);
    if (gAvailableConverters == (char **)0x0) {
      *errCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      tempConverter.preToU[0x1e] = '\0';
      tempConverter.preFromULength = '\0';
      tempConverter.preToULength = '\0';
      tempConverter.preToUFirstLength = '\0';
      converter = ucnv_createConverter_63
                            ((UConverter *)local_140,(char *)0x0,
                             (UErrorCode *)(tempConverter.preToU + 0x1e));
      ucnv_close_63(converter);
      gAvailableConverterCount = 0;
      for (converterName._4_4_ = 0; converterName._4_4_ < (int)tempConverter.toUCallbackReason;
          converterName._4_4_ = converterName._4_4_ + 1) {
        tempConverter.preToU[0x1e] = '\0';
        tempConverter.preFromULength = '\0';
        tempConverter.preToULength = '\0';
        tempConverter.preToUFirstLength = '\0';
        converterName_00 =
             uenum_next_63(en,(int32_t *)0x0,(UErrorCode *)(tempConverter.preToU + 0x1e));
        UVar1 = ucnv_canCreateConverter_63
                          (converterName_00,(UErrorCode *)(tempConverter.preToU + 0x1e));
        if (UVar1 != '\0') {
          uVar2 = (ulong)gAvailableConverterCount;
          gAvailableConverterCount = gAvailableConverterCount + 1;
          gAvailableConverters[uVar2] = converterName_00;
        }
      }
      uenum_close_63(en);
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initAvailableConvertersList(UErrorCode &errCode) {
    U_ASSERT(gAvailableConverterCount == 0);
    U_ASSERT(gAvailableConverters == NULL);

    ucnv_enableCleanup();
    UEnumeration *allConvEnum = ucnv_openAllNames(&errCode);
    int32_t allConverterCount = uenum_count(allConvEnum, &errCode);
    if (U_FAILURE(errCode)) {
        return;
    }

    /* We can't have more than "*converterTable" converters to open */
    gAvailableConverters = (const char **) uprv_malloc(allConverterCount * sizeof(char*));
    if (!gAvailableConverters) {
        errCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    /* Open the default converter to make sure that it has first dibs in the hash table. */
    UErrorCode localStatus = U_ZERO_ERROR;
    UConverter tempConverter;
    ucnv_close(ucnv_createConverter(&tempConverter, NULL, &localStatus));

    gAvailableConverterCount = 0;

    for (int32_t idx = 0; idx < allConverterCount; idx++) {
        localStatus = U_ZERO_ERROR;
        const char *converterName = uenum_next(allConvEnum, NULL, &localStatus);
        if (ucnv_canCreateConverter(converterName, &localStatus)) {
            gAvailableConverters[gAvailableConverterCount++] = converterName;
        }
    }

    uenum_close(allConvEnum);
}